

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_cstep(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_cstep *peVar1;
  uint local_2c;
  int i;
  envy_bios_power_cstep *cstep;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).cstep;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).cstep.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse CSTEP table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).cstep.version);
    }
    else {
      fprintf((FILE *)out,"CSTEP table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).cstep.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).cstep.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; (int)local_2c < (int)(uint)(bios->power).cstep.entriesnum;
          local_2c = local_2c + 1) {
        fprintf((FILE *)out,"\t%i: pstate %x index %d\n",(ulong)local_2c,
                (ulong)(bios->power).cstep.ent1[(int)local_2c].pstate,
                (ulong)(bios->power).cstep.ent1[(int)local_2c].index);
        envy_bios_dump_hex(bios,out,(bios->power).cstep.ent1[(int)local_2c].offset,
                           (uint)(bios->power).cstep.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"---\n");
      for (local_2c = 0; (int)local_2c < (int)(uint)(bios->power).cstep.snr; local_2c = local_2c + 1
          ) {
        if ((bios->power).cstep.ent2[(int)local_2c].valid != '\0') {
          fprintf((FILE *)out,"\t%i: freq %d MHz unkn[0] %x unkn[1] %x voltage %d\n",(ulong)local_2c
                  ,(ulong)(bios->power).cstep.ent2[(int)local_2c].freq,
                  (ulong)(bios->power).cstep.ent2[(int)local_2c].unkn[0],
                  (ulong)(bios->power).cstep.ent2[(int)local_2c].unkn[1],
                  (uint)(bios->power).cstep.ent2[(int)local_2c].voltage);
          envy_bios_dump_hex(bios,out,(bios->power).cstep.ent2[(int)local_2c].offset,
                             (uint)(bios->power).cstep.ssz,mask);
          if ((mask & 0x80000000) != 0) {
            fprintf((FILE *)out,"\n");
          }
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_cstep(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_cstep *cstep = &bios->power.cstep;
	int i;

	if (!cstep->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!cstep->valid) {
		fprintf(out, "Failed to parse CSTEP table at 0x%x, version %x\n", cstep->offset, cstep->version);
		return;
	}

	fprintf(out, "CSTEP table at 0x%x, version %x\n", cstep->offset, cstep->version);
	envy_bios_dump_hex(bios, out, cstep->offset, cstep->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < cstep->entriesnum; i++) {
		fprintf(out, "	%i: pstate %x index %d\n", i,
			cstep->ent1[i].pstate, cstep->ent1[i].index);
		envy_bios_dump_hex(bios, out, cstep->ent1[i].offset, cstep->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}
	fprintf(out, "---\n");
	for (i = 0; i < cstep->snr; i++) {
		if (!cstep->ent2[i].valid)
			continue;

		fprintf(out, "	%i: freq %d MHz unkn[0] %x unkn[1] %x voltage %d\n",
			i, cstep->ent2[i].freq, cstep->ent2[i].unkn[0], cstep->ent2[i].unkn[1], cstep->ent2[i].voltage);
		envy_bios_dump_hex(bios, out, cstep->ent2[i].offset, cstep->ssz, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}